

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::RunContext::getCurrentTestName_abi_cxx11_(string *__return_storage_ptr__,RunContext *this)

{
  allocator local_9;
  
  if (this->m_activeTestCaseInfo == (TestCaseInfo *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)this->m_activeTestCaseInfo);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getCurrentTestName() const CATCH_OVERRIDE {
            return m_activeTestCaseInfo
                ? m_activeTestCaseInfo->name
                : "";
        }